

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatImageTexture *
pbrt::FloatImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  char *args_2;
  FloatImageTexture *pFVar3;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Float FVar4;
  ColorEncodingHandle encoding;
  Transform *in_stack_000000e8;
  ParameterDictionary *in_stack_000000f0;
  Allocator in_stack_000000f8;
  string encodingString;
  char *defaultEncoding;
  string filename;
  Float scale;
  optional<pbrt::WrapMode> wrapMode;
  string wrapString;
  string filter;
  Float maxAniso;
  TextureMapping2DHandle map;
  string *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  TextureParameterDictionary *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  allocator<char> *args_3;
  allocator<char> *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined7 in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5;
  ColorEncodingHandle *args_6;
  undefined4 in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string *e;
  string *in_stack_fffffffffffffd48;
  allocator<char> local_2a9;
  string local_2a8 [39];
  undefined1 local_281 [33];
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  allocator<char> local_209;
  string local_208 [39];
  undefined8 local_1e1;
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  Float local_158;
  optional local_154 [11];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [55];
  undefined1 local_59 [37];
  Float local_34;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_8 = in_RCX;
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_
            ((TextureParameterDictionary *)in_RSI);
  local_30 = local_8;
  TextureMapping2DHandle::Create
            (in_stack_000000f0,in_stack_000000e8,
             (FileLoc *)
             encoding.
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             .bits,in_stack_000000f8);
  e = (string *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  FVar4 = TextureParameterDictionary::GetOneFloat
                    ((TextureParameterDictionary *)in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68,0.0);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  local_34 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  TextureParameterDictionary::GetOneString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pbVar5 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  TextureParameterDictionary::GetOneString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::c_str();
  ParseWrapMode(in_stack_fffffffffffffc88);
  bVar1 = pstd::optional::operator_cast_to_bool(local_154);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string&>((char *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  name = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  FVar4 = TextureParameterDictionary::GetOneFloat
                    ((TextureParameterDictionary *)in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68,0.0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  args_6 = (ColorEncodingHandle *)&local_1e1;
  args_5 = local_18;
  local_158 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  TextureParameterDictionary::GetOneString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  ResolveFilename(pbVar5);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)((long)&local_1e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  uVar2 = HasExtension(in_stack_fffffffffffffd48,e);
  args_2 = "linear";
  if ((bool)uVar2) {
    args_2 = "sRGB";
  }
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_281;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar5,(char *)local_18,(allocator<char> *)args_2);
  args_3 = &local_2a9;
  args_4 = local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar5,(char *)local_18,(allocator<char> *)args_2);
  TextureParameterDictionary::GetOneString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)(local_281 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_281);
  ColorEncodingHandle::Get(name);
  pstd::optional<pbrt::WrapMode>::operator*((optional<pbrt::WrapMode> *)0x6de3fd);
  pFVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,std::__cxx11::string&,float&,pbrt::WrapMode&,float&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)CONCAT17(uVar2,in_stack_fffffffffffffcb8),
                      (TextureMapping2DHandle *)pbVar5,local_18,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
                      (float *)args_3,(WrapMode *)args_4,(float *)args_5,args_6,
                      (polymorphic_allocator<std::byte> *)CONCAT44(FVar4,in_stack_fffffffffffffce0))
  ;
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_1a0);
  pstd::optional<pbrt::WrapMode>::~optional((optional<pbrt::WrapMode> *)0x6de482);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_90);
  return pFVar3;
}

Assistant:

FloatImageTexture *FloatImageTexture::Create(const Transform &renderFromTexture,
                                             const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString);

    return alloc.new_object<FloatImageTexture>(map, filename, filter, maxAniso, *wrapMode,
                                               scale, encoding, alloc);
}